

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall
TTD::RuntimeContextInfo::GatherKnownObjectToPathMap(RuntimeContextInfo *this,ScriptContext *ctx)

{
  TTAutoString *nullString;
  Type pPVar1;
  Var pvVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  JavascriptFunction *pJVar7;
  RecyclableObject **ppRVar8;
  Type *ppPVar9;
  RecyclableObject *pRVar10;
  DynamicObject *this_00;
  char *msg;
  int index;
  undefined1 local_80 [8];
  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  propertyRecordList;
  Var pitem;
  Var getter;
  Var setter;
  
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
       &Memory::HeapAllocator::Instance;
  local_80 = (undefined1  [8])&PTR_IsReadOnly_014e5f78;
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  propertyRecordList.
  super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  EnqueueRootPathObject
            (this,L"global",(RecyclableObject *)(ctx->super_ScriptContextBase).globalObject);
  EnqueueRootPathObject
            (this,L"null",
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nullValue.ptr);
  pRVar6 = Js::VarTo<Js::RecyclableObject>
                     ((((ctx->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).
                      ptr);
  EnqueueRootPathObject(this,L"undeclBlockVar",pRVar6);
  EnqueueRootPathObject
            (this,L"_defaultAccessor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             defaultAccessorFunction.ptr);
  if (((ctx->config).threadConfig)->m_errorStackTrace == true) {
    EnqueueRootPathObject
              (this,L"_stackTraceAccessor",
               (RecyclableObject *)
               (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               stackTraceAccessorFunction.ptr);
  }
  EnqueueRootPathObject
            (this,L"_throwTypeErrorRestrictedPropertyAccessor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             throwTypeErrorRestrictedPropertyAccessorFunction.ptr);
  EnqueueRootPathObject
            (this,L"_identityFunction",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->identityFunction).ptr);
  EnqueueRootPathObject
            (this,L"_throwerFunction",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->throwerFunction).ptr);
  bVar3 = Js::ScriptContext::IsJsBuiltInEnabled(ctx);
  if (bVar3) {
    Js::JavascriptLibrary::EnsureArrayBuiltInsAreReady
              ((ctx->super_ScriptContextBase).javascriptLibrary);
  }
  EnqueueRootPathObject
            (this,L"_arrayIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               arrayIteratorPrototype.ptr)->super_RecyclableObject);
  EnqueueRootPathObject
            (this,L"_mapIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               mapIteratorPrototype.ptr)->super_RecyclableObject);
  EnqueueRootPathObject
            (this,L"_setIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               setIteratorPrototype.ptr)->super_RecyclableObject);
  EnqueueRootPathObject
            (this,L"_stringIteratorPrototype",
             &((((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               stringIteratorPrototype.ptr)->super_RecyclableObject);
  pJVar7 = Js::JavascriptLibrary::EnsureGeneratorNextFunction
                     ((ctx->super_ScriptContextBase).javascriptLibrary);
  EnqueueRootPathObject(this,L"_generatorNextFunction",(RecyclableObject *)pJVar7);
  pJVar7 = Js::JavascriptLibrary::EnsureGeneratorReturnFunction
                     ((ctx->super_ScriptContextBase).javascriptLibrary);
  EnqueueRootPathObject(this,L"_generatorReturnFunction",(RecyclableObject *)pJVar7);
  pJVar7 = Js::JavascriptLibrary::EnsureGeneratorThrowFunction
                     ((ctx->super_ScriptContextBase).javascriptLibrary);
  EnqueueRootPathObject(this,L"_generatorThrowFunction",(RecyclableObject *)pJVar7);
  EnqueueRootPathObject
            (this,L"_generatorFunctionConstructor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             generatorFunctionConstructor.ptr);
  EnqueueRootPathObject
            (this,L"_asyncFunctionConstructor",
             (RecyclableObject *)
             (((ctx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             asyncFunctionConstructor.ptr);
  setter = this;
  do {
    pvVar2 = setter;
    if (*setter == setter) {
      nullString = (TTAutoString *)((long)setter + 0x20);
      SortDictIntoListOnNames<Js::RecyclableObject*>
                ((BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)((long)setter + 0x38),
                 (List<Js::RecyclableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)((long)setter + 0xe0),nullString);
      SortDictIntoListOnNames<Js::FunctionBody*>
                ((BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)((long)pvVar2 + 0x70),
                 (List<Js::FunctionBody_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)((long)pvVar2 + 0x110),nullString);
      SortDictIntoListOnNames<Js::DebuggerScope*>
                ((BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)((long)pvVar2 + 0xa8),
                 (List<Js::DebuggerScope_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)((long)pvVar2 + 0x140),nullString);
      local_80 = (undefined1  [8])&PTR_IsReadOnly_014e5f78;
      if (propertyRecordList.
          super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.
          _vptr_ReadOnlyList != (_func_int **)0x0) {
        Memory::HeapAllocator::Free
                  ((HeapAllocator *)
                   propertyRecordList.
                   super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                   ._16_8_,propertyRecordList.
                           super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                           ._vptr_ReadOnlyList,
                   (long)(int)propertyRecordList.
                              super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                              .alloc << 3);
      }
      return;
    }
    ppRVar8 = DListBase<Js::RecyclableObject_*,_RealCount>::Head
                        ((DListBase<Js::RecyclableObject_*,_RealCount> *)setter);
    pRVar6 = *ppRVar8;
    DListBase<Js::RecyclableObject_*,_RealCount>::RemoveHead<Memory::HeapAllocator>
              ((DListBase<Js::RecyclableObject_*,_RealCount> *)setter,
               *(HeapAllocator **)((long)setter + 0x18));
    propertyRecordList.
    super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>.buffer.
    _0_4_ = 0;
    LoadAndOrderPropertyNames
              (pRVar6,(List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_80);
    if (0 < (int)propertyRecordList.
                 super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                 .buffer) {
      index = 0;
      do {
        ppPVar9 = JsUtil::
                  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_80,index);
        pPVar1 = *ppPVar9;
        pitem = (Var)0x0;
        getter = (Var)0x0;
        iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x15])
                          (pRVar6,(ulong)(uint)pPVar1->pid,&pitem,&getter);
        if (iVar4 == 0) {
          propertyRecordList._40_8_ = 0;
          BVar5 = Js::JavascriptOperators::GetOwnProperty
                            (pRVar6,pPVar1->pid,(Var *)&propertyRecordList.field_0x28,ctx,
                             (PropertyValueInfo *)0x0);
          if (BVar5 == 0) {
            TTDAbort_unrecoverable_error("Not sure what went wrong.");
          }
          EnqueueNewPathVarAsNeeded
                    ((RuntimeContextInfo *)setter,pRVar6,(Var)propertyRecordList._40_8_,
                     (char16 *)(pPVar1 + 1),(char16 *)0x0);
        }
        else {
          if (pitem != (Var)0x0) {
            BVar5 = Js::JavascriptOperators::IsUndefinedObject(pitem);
            if (BVar5 == 0) {
              bVar3 = Js::VarIs<Js::JavascriptFunction>(pitem);
              if (!bVar3) {
                msg = "The getter is not a function?";
                goto LAB_008f60e2;
              }
              EnqueueNewPathVarAsNeeded
                        ((RuntimeContextInfo *)setter,pRVar6,pitem,(char16 *)(pPVar1 + 1),L">");
            }
          }
          if (getter != (Var)0x0) {
            BVar5 = Js::JavascriptOperators::IsUndefinedObject(getter);
            if (BVar5 == 0) {
              bVar3 = Js::VarIs<Js::JavascriptFunction>(getter);
              if (!bVar3) {
                msg = "The setter is not a function?";
LAB_008f60e2:
                TTDAbort_unrecoverable_error(msg);
              }
              pRVar10 = Js::VarTo<Js::RecyclableObject>(getter);
              EnqueueNewPathVarAsNeeded
                        ((RuntimeContextInfo *)setter,pRVar6,pRVar10,(char16 *)(pPVar1 + 1),L"<");
            }
          }
        }
        index = index + 1;
      } while (index < (int)propertyRecordList.
                            super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                            .buffer);
    }
    bVar3 = Js::DynamicType::Is(((pRVar6->type).ptr)->typeId);
    if (bVar3) {
      this_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar6);
      bVar3 = Js::DynamicObject::HasObjectArray(this_00);
      if (bVar3 && this_00->field_1 != (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0) {
        EnqueueNewPathVarAsNeeded
                  ((RuntimeContextInfo *)setter,pRVar6,(Var)this_00->field_1,L"_object_array_",
                   (char16 *)0x0);
      }
    }
    pRVar10 = Js::RecyclableObject::GetPrototype(pRVar6);
    if (pRVar10 != (RecyclableObject *)0x0) {
      BVar5 = Js::JavascriptOperators::IsUndefinedOrNullType(((pRVar10->type).ptr)->typeId);
      if (BVar5 == 0) {
        EnqueueNewPathVarAsNeeded
                  ((RuntimeContextInfo *)setter,pRVar6,pRVar10,L"_proto_",(char16 *)0x0);
      }
    }
    (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x5e])(pRVar6);
  } while( true );
}

Assistant:

void RuntimeContextInfo::GatherKnownObjectToPathMap(Js::ScriptContext* ctx)
    {
        JsUtil::List<const Js::PropertyRecord*, HeapAllocator> propertyRecordList(&HeapAllocator::Instance);

        this->EnqueueRootPathObject(_u("global"), ctx->GetGlobalObject());
        this->EnqueueRootPathObject(_u("null"), ctx->GetLibrary()->GetNull());
        this->EnqueueRootPathObject(_u("undeclBlockVar"), Js::VarTo<Js::RecyclableObject>(ctx->GetLibrary()->GetUndeclBlockVar()));

        this->EnqueueRootPathObject(_u("_defaultAccessor"), ctx->GetLibrary()->GetDefaultAccessorFunction());

        if(ctx->GetConfig()->IsErrorStackTraceEnabled())
        {
            this->EnqueueRootPathObject(_u("_stackTraceAccessor"), ctx->GetLibrary()->GetStackTraceAccessorFunction());
        }

        this->EnqueueRootPathObject(_u("_throwTypeErrorRestrictedPropertyAccessor"), ctx->GetLibrary()->GetThrowTypeErrorRestrictedPropertyAccessorFunction());

        this->EnqueueRootPathObject(_u("_identityFunction"), ctx->GetLibrary()->GetIdentityFunction());
        this->EnqueueRootPathObject(_u("_throwerFunction"), ctx->GetLibrary()->GetThrowerFunction());

       // ArrayIteratorPrototype is not created when we have JsBuiltins, it it created on-demand only
#ifdef ENABLE_JS_BUILTINS
        if (ctx->IsJsBuiltInEnabled())
        {
            ctx->GetLibrary()->EnsureArrayBuiltInsAreReady();
        }
#endif
        this->EnqueueRootPathObject(_u("_arrayIteratorPrototype"), ctx->GetLibrary()->GetArrayIteratorPrototype());
        this->EnqueueRootPathObject(_u("_mapIteratorPrototype"), ctx->GetLibrary()->GetMapIteratorPrototype());
        this->EnqueueRootPathObject(_u("_setIteratorPrototype"), ctx->GetLibrary()->GetSetIteratorPrototype());
        this->EnqueueRootPathObject(_u("_stringIteratorPrototype"), ctx->GetLibrary()->GetStringIteratorPrototype());

        this->EnqueueRootPathObject(_u("_generatorNextFunction"), ctx->GetLibrary()->EnsureGeneratorNextFunction());
        this->EnqueueRootPathObject(_u("_generatorReturnFunction"), ctx->GetLibrary()->EnsureGeneratorReturnFunction());
        this->EnqueueRootPathObject(_u("_generatorThrowFunction"), ctx->GetLibrary()->EnsureGeneratorThrowFunction());
        this->EnqueueRootPathObject(_u("_generatorFunctionConstructor"), ctx->GetLibrary()->GetGeneratorFunctionConstructor());
        this->EnqueueRootPathObject(_u("_asyncFunctionConstructor"), ctx->GetLibrary()->GetAsyncFunctionConstructor());

        uint32 counter = 0;
        while(!this->m_worklist.Empty())
        {
            Js::RecyclableObject* curr = this->m_worklist.Dequeue();

            counter++;

            ////
            //Handle the standard properties for all object types

            //load propArray with all property names
            propertyRecordList.Clear();
            LoadAndOrderPropertyNames(curr, propertyRecordList);

            //access each property and process the target objects as needed
            for(int32 i = 0; i < propertyRecordList.Count(); ++i)
            {
                const Js::PropertyRecord* precord = propertyRecordList.Item(i);

                Js::Var getter = nullptr;
                Js::Var setter = nullptr;
                if(curr->GetAccessors(precord->GetPropertyId(), &getter, &setter, ctx))
                {
                    if(getter != nullptr && !Js::JavascriptOperators::IsUndefinedObject(getter))
                    {
                        TTDAssert(Js::VarIs<Js::JavascriptFunction>(getter), "The getter is not a function?");
                        this->EnqueueNewPathVarAsNeeded(curr, getter, precord, _u(">"));
                    }

                    if(setter != nullptr && !Js::JavascriptOperators::IsUndefinedObject(setter))
                    {
                        TTDAssert(Js::VarIs<Js::JavascriptFunction>(setter), "The setter is not a function?");
                        this->EnqueueNewPathVarAsNeeded(curr, Js::VarTo<Js::RecyclableObject>(setter), precord, _u("<"));
                    }
                }
                else
                {
                    Js::Var pitem = nullptr;
                    BOOL isproperty = Js::JavascriptOperators::GetOwnProperty(curr, precord->GetPropertyId(), &pitem, ctx, nullptr);
                    TTDAssert(isproperty, "Not sure what went wrong.");

                    this->EnqueueNewPathVarAsNeeded(curr, pitem, precord, nullptr);
                }
            }

            //shouldn't have any dynamic array valued properties
            if(Js::DynamicType::Is(curr->GetTypeId()))
            {
                Js::ArrayObject* parray = Js::VarTo<Js::DynamicObject>(curr)->GetObjectArray();
                if(parray != nullptr)
                {
                    this->EnqueueNewPathVarAsNeeded(curr, parray, _u("_object_array_"));
                }
            }

            Js::RecyclableObject* proto = curr->GetPrototype();
            bool skipProto = (proto == nullptr) || Js::JavascriptOperators::IsUndefinedOrNullType(proto->GetTypeId());
            if(!skipProto)
            {
                this->EnqueueNewPathVarAsNeeded(curr, proto, _u("_proto_"));
            }

            curr->ProcessCorePaths();
        }

        SortDictIntoListOnNames<Js::RecyclableObject*>(this->m_coreObjToPathMap, this->m_sortedObjectList, this->m_nullString);
        SortDictIntoListOnNames<Js::FunctionBody*>(this->m_coreBodyToPathMap, this->m_sortedFunctionBodyList, this->m_nullString);
        SortDictIntoListOnNames<Js::DebuggerScope*>(this->m_coreDbgScopeToPathMap, this->m_sortedDbgScopeList, this->m_nullString);
    }